

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-help.c
# Opt level: O3

_Bool show_file(char *name,char *what,int line,int mode)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ang_file *f;
  char *pcVar7;
  __int32_t **pp_Var8;
  ushort **ppuVar9;
  long lVar10;
  int iVar11;
  byte *pbVar12;
  undefined8 extraout_RDX;
  byte bVar13;
  uint uVar14;
  char *pcVar15;
  keycode_t kVar16;
  bool bVar17;
  keypress kVar18;
  int hgt;
  int wid;
  char shower [80];
  char tmp [80];
  char finder [80];
  char caption [128];
  char hook [26] [32];
  char buf [1024];
  char lc_buf [1024];
  char filename [1024];
  char path [1024];
  int local_152c;
  char *local_1528;
  uint local_1520;
  wchar_t local_151c;
  size_t local_1518;
  ulong local_1510;
  int local_1508;
  uint local_1504;
  ulong local_1500;
  ulong local_14f8;
  int local_14f0;
  int local_14ec;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  char local_1378 [836];
  char local_1034 [7];
  byte local_102d;
  char local_102c;
  char local_102a [1010];
  byte local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  local_1408 = 0;
  uStack_1400 = 0;
  local_1418 = 0;
  uStack_1410 = 0;
  local_1428 = 0;
  uStack_1420 = 0;
  local_1438 = 0;
  uStack_1430 = 0;
  local_1448 = 0;
  uStack_1440 = 0;
  local_14a8 = 0;
  uStack_14a0 = 0;
  local_14b8 = 0;
  uStack_14b0 = 0;
  local_14c8 = 0;
  uStack_14c0 = 0;
  local_14d8 = 0;
  uStack_14d0 = 0;
  local_14e8 = 0;
  uStack_14e0 = 0;
  local_1388 = 0;
  uStack_1380 = 0;
  local_1398 = 0;
  uStack_1390 = 0;
  local_13a8 = 0;
  uStack_13a0 = 0;
  local_13b8 = 0;
  uStack_13b0 = 0;
  local_13c8 = 0;
  uStack_13c0 = 0;
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13e8 = 0;
  uStack_13e0 = 0;
  local_13f8 = 0;
  uStack_13f0 = 0;
  pcVar15 = (char *)0x0;
  local_1378[0] = '\0';
  local_1378[0x20] = 0;
  local_1378[0x40] = 0;
  local_1378[0x60] = 0;
  local_1378[0x80] = 0;
  local_1378[0xa0] = 0;
  local_1378[0xc0] = 0;
  local_1378[0xe0] = 0;
  local_1378[0x100] = 0;
  local_1378[0x120] = 0;
  local_1378[0x140] = 0;
  local_1378[0x160] = 0;
  local_1378[0x180] = 0;
  local_1378[0x1a0] = 0;
  local_1378[0x1c0] = 0;
  local_1378[0x1e0] = 0;
  local_1378[0x200] = 0;
  local_1378[0x220] = 0;
  local_1378[0x240] = 0;
  local_1378[0x260] = 0;
  local_1378[0x280] = 0;
  local_1378[0x2a0] = 0;
  local_1378[0x2c0] = 0;
  local_1378[0x2e0] = 0;
  local_1378[0x300] = 0;
  local_1378[800] = 0;
  local_1508 = mode;
  Term_get_size(&local_14ec,&local_152c);
  my_strcpy(local_838,name,0x400);
  sVar5 = strlen(local_838);
  if (0 < (int)(uint)sVar5) {
    uVar6 = (ulong)((uint)sVar5 & 0x7fffffff);
    pcVar15 = local_838;
    do {
      pcVar15 = pcVar15 + 1;
      if (pcVar15[-1] == '#') {
        pcVar15[-1] = '\0';
        goto LAB_001cfcbc;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    pcVar15 = (char *)0x0;
  }
LAB_001cfcbc:
  if (what != (char *)0x0) {
    my_strcpy((char *)&local_13f8,what,0x80);
    my_strcpy(local_438,local_838,0x400);
    f = file_open(local_438,MODE_READ,FTYPE_TEXT);
    if (f != (ang_file *)0x0) goto LAB_001cfd6d;
  }
  strnfmt((char *)&local_13f8,0x80,"Help file \'%s\'",local_838);
  path_build(local_438,0x400,ANGBAND_DIR_HELP,local_838);
  f = file_open(local_438,MODE_READ,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    msg("Cannot open \'%s\'.",local_838);
    event_signal(EVENT_MESSAGE_FLUSH);
    return true;
  }
LAB_001cfd6d:
  pcVar7 = local_1378 + 0x340;
  _Var2 = file_getl(f,pcVar7,0x400);
  if (_Var2) {
    local_1500 = 0;
    uVar6 = 0;
LAB_001cfd9b:
    bVar17 = false;
    do {
      if (bVar17) {
        _Var2 = contains_only_spaces(pcVar7);
        bVar17 = !_Var2;
        _Var2 = file_getl(f,pcVar7,0x400);
      }
      else {
        _Var2 = prefix(pcVar7,".. ");
        if (!_Var2) goto LAB_001cfe93;
        _Var2 = prefix(local_1378 + 0x343,"menu:: [");
        if ((_Var2) && (local_102c == ']')) {
          local_1500 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          if ((byte)(local_102d + 0x9f) < 0x1a) {
            my_strcpy(local_1378 + (ulong)(local_102d - 0x61) * 0x20,local_102a,0x20);
          }
        }
        else if (local_1378[0x343] == '_' && pcVar15 != (char *)0x0) {
          sVar5 = strlen(pcVar7);
          pcVar7[sVar5 - 1] = '\0';
          iVar3 = strcmp(local_1034,pcVar15);
          if (iVar3 == 0) {
            line = (uint)uVar6;
          }
        }
        _Var2 = file_getl(f,pcVar7,0x400);
        bVar17 = true;
      }
      if (_Var2 == false) goto LAB_001cfeba;
    } while( true );
  }
  uVar6 = 0;
  local_1500 = 0;
LAB_001cfeba:
  local_1520 = (uint)uVar6;
  local_14f0 = local_1520 + 4;
  pcVar15 = local_1378 + 0x340;
  local_1504 = 0;
  local_1510 = 0;
  local_1528 = (char *)0x0;
  local_14f8 = uVar6;
LAB_001cfeef:
  do {
    Term_clear();
    uVar4 = local_14f0 - local_152c;
    if (line < local_14f0 - local_152c) {
      uVar4 = line;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    if ((int)uVar4 < (int)local_1520) {
      file_close(f);
      f = file_open(local_438,MODE_READ,FTYPE_TEXT);
      if (f == (ang_file *)0x0) {
        return true;
      }
      local_1520 = 0;
    }
    bVar17 = false;
    while (iVar3 = 0, (int)local_1520 < (int)uVar4) {
      while( true ) {
        _Var2 = file_getl(f,pcVar15,0x400);
        if (!_Var2) goto LAB_001cffbb;
        if (!bVar17) break;
        _Var2 = contains_only_spaces(pcVar15);
        if (_Var2) {
          bVar17 = false;
        }
      }
      _Var2 = prefix(pcVar15,".. ");
      local_1520 = local_1520 + !_Var2;
      if (_Var2) {
        bVar17 = true;
      }
    }
LAB_001cffbb:
    iVar11 = iVar3;
    if (iVar11 < local_152c + -4) {
      do {
        if (iVar11 == 0) {
          uVar4 = local_1520;
        }
        _Var2 = file_getl(f,pcVar15,0x400);
        if (!_Var2) break;
        if (bVar17) {
          _Var2 = contains_only_spaces(pcVar15);
          bVar1 = bVar17;
          if (_Var2) {
            bVar1 = false;
          }
        }
        else {
          _Var2 = prefix(pcVar15,".. ");
          bVar1 = true;
          if (!_Var2) goto LAB_001d002d;
        }
        bVar17 = bVar1;
        if (local_152c + -4 <= iVar11) break;
      } while( true );
    }
    if (local_1528 == (char *)0x0) {
      uVar14 = (uint)local_14f8;
      pcVar7 = format("[%s, %s, Line %d-%d/%d]",buildid,&local_13f8,(ulong)uVar4,
                      (ulong)((uVar4 + local_152c) - 4),local_14f8 & 0xffffffff);
      prt(pcVar7,L'\0',L'\0');
      if ((local_1500 & 1) == 0) {
        if (local_152c + -4 < (int)uVar14) {
          pcVar7 = "[Press Space to advance, or ESC to exit.]";
        }
        else {
          pcVar7 = "[Press ESC to exit.]";
        }
      }
      else {
        pcVar7 = "[Press a Letter, or ESC to exit.]";
      }
      prt(pcVar7,local_152c + L'\xffffffff',L'\0');
      kVar18 = inkey();
      uVar6 = kVar18._0_8_ >> 0x20;
      local_151c = CONCAT31(local_151c._1_3_,uVar6 != 0x3f);
      if (uVar6 == 0x3f) goto LAB_001d05b6;
      kVar16 = kVar18.code;
      local_1518 = CONCAT71(local_1518._1_7_,kVar16 == 0x21);
      line = uVar4;
      if (kVar16 == 0x2f) {
        prt("Find: ",local_152c + L'\xffffffff',L'\0');
        _Var2 = askfor_aux((char *)&local_1448,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (_Var2) {
          if (((local_1510 & 1) == 0) && (bVar13 = (byte)local_1448, (byte)local_1448 != 0)) {
            pp_Var8 = __ctype_tolower_loc();
            pbVar12 = (byte *)((long)&local_1448 + 1);
            do {
              pbVar12[-1] = *(byte *)(*pp_Var8 + bVar13);
              bVar13 = *pbVar12;
              pbVar12 = pbVar12 + 1;
            } while (bVar13 != 0);
          }
          my_strcpy((char *)&local_14e8,(char *)&local_1448,0x50);
          uVar14 = (uint)local_14f8;
          line = uVar4 + 1;
          local_1528 = (char *)&local_1448;
          local_1504 = uVar4;
          goto LAB_001d0317;
        }
        uVar6 = 0x2f;
LAB_001d03b5:
        local_1528 = (char *)0x0;
        bVar13 = (byte)local_1518;
        goto switchD_001d04f8_caseD_98;
      }
      if (kVar16 == 0x26) {
        prt("Show: ",local_152c + L'\xffffffff',L'\0');
        askfor_aux((char *)&local_14e8,0x50,
                   (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (((local_1510 & 1) != 0) || (bVar13 = (byte)local_14e8, (byte)local_14e8 == 0)) {
          uVar6 = 0x26;
          goto LAB_001d03b5;
        }
        pp_Var8 = __ctype_tolower_loc();
        pbVar12 = (byte *)((long)&local_14e8 + 1);
        do {
          pbVar12[-1] = *(byte *)(*pp_Var8 + bVar13);
          bVar13 = *pbVar12;
          pbVar12 = pbVar12 + 1;
        } while (bVar13 != 0);
        uVar14 = (uint)local_14f8;
      }
      local_1528 = (char *)0x0;
LAB_001d0317:
      bVar13 = (byte)local_1518;
      if (kVar16 == 0x25) {
        pcVar7 = "index.txt";
        if ((player->opts).opt[1] != false) {
          pcVar7 = "r_index.txt";
        }
        my_strcpy((char *)&local_1498,pcVar7,0x50);
        prt("Goto File: ",local_152c + L'\xffffffff',L'\0');
        _Var2 = askfor_aux((char *)&local_1498,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        uVar6 = 0x25;
        if (_Var2) {
          _Var2 = show_file((char *)&local_1498,(char *)0x0,0,local_1508);
          uVar6 = 0xe000;
          if (_Var2) {
            uVar6 = 0x25;
          }
        }
      }
      else if (kVar16 == 0x23) {
        uStack_1490 = 0;
        local_1458 = 0;
        uStack_1450 = 0;
        local_1468 = 0;
        uStack_1460 = 0;
        local_1478 = 0;
        uStack_1470 = 0;
        local_1488 = 0;
        uStack_1480 = 0;
        local_1498 = 0x30;
        prt("Goto Line: ",local_152c + L'\xffffffff',L'\0');
        _Var2 = askfor_aux((char *)&local_1498,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (_Var2) {
          line = atoi((char *)&local_1498);
        }
        uVar6 = 0x23;
        goto switchD_001d04f8_caseD_98;
      }
      iVar3 = (int)uVar6;
      if (iVar3 < 0x6a) {
        switch(iVar3) {
        case 0x2d:
        case 0x39:
switchD_001d04f8_caseD_95:
          line = (line - local_152c) + 4;
          break;
        case 0x2e:
        case 0x2f:
        case 0x30:
        case 0x34:
        case 0x35:
        case 0x36:
          break;
        case 0x31:
switchD_001d04f8_caseD_96:
          line = uVar14;
          break;
        case 0x32:
          goto switchD_001d04f8_caseD_9c;
        case 0x33:
switchD_001d04f8_caseD_97:
          line = (line + local_152c) - 4;
          break;
        case 0x37:
switchD_001d04f8_caseD_94:
          line = 0;
          break;
        case 0x38:
switchD_001d0512_caseD_38:
          line = line - 1;
          break;
        default:
          if (iVar3 == 0x20) goto switchD_001d04f8_caseD_97;
        }
      }
      else if (iVar3 < 0x83) {
        if (iVar3 != 0x6a) {
          if (iVar3 == 0x6b) goto switchD_001d0512_caseD_38;
          if (iVar3 != 0x80) goto switchD_001d04f8_caseD_98;
        }
switchD_001d04f8_caseD_9c:
        line = line + 1;
      }
      else {
        switch(iVar3) {
        case 0x94:
          goto switchD_001d04f8_caseD_94;
        case 0x95:
          goto switchD_001d04f8_caseD_95;
        case 0x96:
          goto switchD_001d04f8_caseD_96;
        case 0x97:
          goto switchD_001d04f8_caseD_97;
        case 0x98:
        case 0x99:
        case 0x9a:
        case 0x9b:
          break;
        case 0x9c:
          goto switchD_001d04f8_caseD_9c;
        default:
          if (iVar3 == 0x83) goto switchD_001d0512_caseD_38;
        }
      }
switchD_001d04f8_caseD_98:
      local_1510 = CONCAT71((int7)(local_1510 >> 8),(byte)local_1510 ^ bVar13);
      if ((((local_1500 & 1) == 0) ||
          (ppuVar9 = __ctype_b_loc(), (*(byte *)((long)*ppuVar9 + (uVar6 & 0xff) * 2 + 1) & 4) == 0)
          ) || (uVar4 = (int)uVar6 - 0x61, 0x19 < uVar4)) {
        if ((int)uVar6 == 0xe000) {
LAB_001d05b6:
          file_close(f);
          return (_Bool)(undefined1)local_151c;
        }
      }
      else {
        lVar10 = (ulong)uVar4 * 0x20;
        if ((local_1378[lVar10] != '\0') &&
           (_Var2 = show_file(local_1378 + lVar10,(char *)0x0,0,local_1508), !_Var2))
        goto LAB_001d05b6;
      }
      goto LAB_001cfeef;
    }
    bell();
    local_1528 = (char *)0x0;
    line = local_1504;
  } while( true );
LAB_001cfe93:
  uVar6 = (ulong)((uint)uVar6 + 1);
  _Var2 = file_getl(f,pcVar7,0x400);
  if (!_Var2) goto LAB_001cfeba;
  goto LAB_001cfd9b;
LAB_001d002d:
  my_strcpy((char *)local_c38,pcVar15,0x400);
  bVar13 = local_c38[0];
  if (((local_1510 & 1) == 0) && (local_c38[0] != 0)) {
    pp_Var8 = __ctype_tolower_loc();
    pbVar12 = local_c38;
    do {
      pbVar12 = pbVar12 + 1;
      pbVar12[-1] = *(byte *)(*pp_Var8 + bVar13);
      bVar13 = *pbVar12;
    } while (bVar13 != 0);
  }
  local_1520 = local_1520 + 1;
  if ((local_1528 != (char *)0x0) && (iVar11 == 0)) {
    pcVar7 = strstr((char *)local_c38,local_1528);
    iVar3 = 0;
    if (pcVar7 == (char *)0x0) goto LAB_001cffbb;
  }
  local_151c = iVar11 + L'\x02';
  Term_putstr(L'\0',local_151c,L'\xffffffff',L'\x01',pcVar15);
  if ((byte)local_14e8 != '\0') {
    pbVar12 = local_c38;
    while( true ) {
      local_1528 = strstr((char *)pbVar12,(char *)&local_14e8);
      if (local_1528 == (char *)0x0) break;
      local_1518 = strlen((char *)&local_14e8);
      Term_putstr((wchar_t)((long)local_1528 - (long)local_c38),local_151c,(wchar_t)local_1518,L'\v'
                  ,local_1378 + ((long)local_1528 - (long)local_c38) + 0x340);
      pbVar12 = (byte *)(local_1528 + (int)local_1518);
    }
  }
  local_1528 = (char *)0x0;
  iVar3 = iVar11 + 1;
  goto LAB_001cffbb;
}

Assistant:

bool show_file(const char *name, const char *what, int line, int mode)
{
	int i, k, n;

	struct keypress ch = KEYPRESS_NULL;

	/* Number of "real" lines passed by */
	int next = 0;

	/* Number of "real" lines in the file */
	int size;

	/* Backup value for "line" */
	int back = 0;

	/* This screen has sub-screens */
	bool menu = false;

	/* Case sensitive search */
	bool case_sensitive = false;

	/* Current help file */
	ang_file *fff = NULL;

	/* Find this string (if any) */
	char *find = NULL;

	/* Jump to this tag */
	const char *tag = NULL;

	/* Hold a string to find */
	char finder[80] = "";

	/* Hold a string to show */
	char shower[80] = "";

	/* Filename */
	char filename[1024];

	/* Describe this thing */
	char caption[128] = "";

	/* Path buffer */
	char path[1024];

	/* General buffer */
	char buf[1024];

	/* Lower case version of the buffer, for searching */
	char lc_buf[1024];

	/* Sub-menu information */
	char hook[26][32];

	int wid, hgt;
	
	/* true if we are inside a RST block that should be skipped */
	bool skip_lines = false;



	/* Wipe the hooks */
	for (i = 0; i < 26; i++) hook[i][0] = '\0';

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Copy the filename */
	my_strcpy(filename, name, sizeof(filename));

	n = strlen(filename);

	/* Extract the tag from the filename */
	for (i = 0; i < n; i++) {
		if (filename[i] == '#') {
			filename[i] = '\0';
			tag = filename + i + 1;
			break;
		}
	}

	/* Redirect the name */
	name = filename;

	/* Currently unused facility to show and describe arbitrary files */
	if (what) {
		my_strcpy(caption, what, sizeof(caption));

		my_strcpy(path, name, sizeof(path));
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Look in "help" */
	if (!fff) {
		strnfmt(caption, sizeof(caption), "Help file '%s'", name);

		path_build(path, sizeof(path), ANGBAND_DIR_HELP, name);
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Oops */
	if (!fff) {
		/* Message */
		msg("Cannot open '%s'.", name);
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Oops */
		return (true);
	}


	/* Pre-Parse the file */
	while (true) {
		/* Read a line or stop */
		if (!file_getl(fff, buf, sizeof(buf))) break;

		/* Skip lines if we are inside a RST directive */
		if (skip_lines){
			if (contains_only_spaces(buf))
				skip_lines = false;
			continue;
		}

		/* Parse a very small subset of RST */
		/* TODO: should be more flexible */
		if (prefix(buf, ".. ")) {
			/* parse ".. menu:: [x] filename.txt" (with exact spacing)*/
			if (prefix(buf+strlen(".. "), "menu:: [") && 
                           buf[strlen(".. menu:: [x")]==']') {
				/* This is a menu file */
				menu = true;

				/* Extract the menu item */
				k = A2I(buf[strlen(".. menu:: [")]);

				/* Store the menu item (if valid) */
				if ((k >= 0) && (k < 26))
					my_strcpy(hook[k], buf + strlen(".. menu:: [x] "),
							  sizeof(hook[0]));
			} else if (buf[strlen(".. ")] == '_') {
				/* parse ".. _some_hyperlink_target:" */
				if (tag) {
					/* Remove the closing '>' of the tag */
					buf[strlen(buf) - 1] = '\0';

					/* Compare with the requested tag */
					if (streq(buf + strlen(".. _"), tag)) {
						/* Remember the tagged line */
						line = next;
					}
				}
			}

			/* Skip this and enter skip mode*/
			skip_lines = true;
			continue;
		}

		/* Count the "real" lines */
		next++;
	}

	/* Save the number of "real" lines */
	size = next;


	/* Display the file */
	while (true) {
		/* Clear screen */
		Term_clear();


		/* Restrict the visible range */
		if (line > (size - (hgt - 4))) line = size - (hgt - 4);
		if (line < 0) line = 0;

		skip_lines = false;

		/* Re-open the file if needed */
		if (next > line) {
			/* Close it */
			file_close(fff);

			/* Hack -- Re-Open the file */
			fff = file_open(path, MODE_READ, FTYPE_TEXT);
			if (!fff) return (true);

			/* File has been restarted */
			next = 0;
		}


		/* Goto the selected line */
		while (next < line) {
			/* Get a line */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive*/
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines=false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the lines */
			next++;
		}


		/* Dump the next lines of the file */
		for (i = 0; i < hgt - 4; ) {
			/* Hack -- track the "first" line */
			if (!i) line = next;

			/* Get a line of the file or stop */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive */
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines = false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the "real" lines */
			next++;

			/* Make a copy of the current line for searching */
			my_strcpy(lc_buf, buf, sizeof(lc_buf));

			/* Make the line lower case */
			if (!case_sensitive) string_lower(lc_buf);

			/* Hack -- keep searching */
			if (find && !i && !strstr(lc_buf, find)) continue;

			/* Hack -- stop searching */
			find = NULL;

			/* Dump the line */
			Term_putstr(0, i+2, -1, COLOUR_WHITE, buf);

			/* Highlight "shower" */
			if (strlen(shower)) {
				const char *str = lc_buf;

				/* Display matches */
				while ((str = strstr(str, shower)) != NULL) {
					int len = strlen(shower);

					/* Display the match */
					Term_putstr(str-lc_buf, i+2, len, COLOUR_YELLOW,
								&buf[str-lc_buf]);

					/* Advance */
					str += len;
				}
			}

			/* Count the printed lines */
			i++;
		}

		/* Hack -- failed search */
		if (find) {
			bell();
			line = back;
			find = NULL;
			continue;
		}


		/* Show a general "title" */
		prt(format("[%s, %s, Line %d-%d/%d]", buildid,
		           caption, line, line + hgt - 4, size), 0, 0);


		/* Prompt */
		if (menu) {
			/* Menu screen */
			prt("[Press a Letter, or ESC to exit.]", hgt - 1, 0);
		} else if (size <= hgt - 4) {
			/* Small files */
			prt("[Press ESC to exit.]", hgt - 1, 0);
		} else {
			/* Large files */
			prt("[Press Space to advance, or ESC to exit.]", hgt - 1, 0);
		}

		/* Get a keypress */
		ch = inkey();

		/* Exit the help */
		if (ch.code == '?') break;

		/* Toggle case sensitive on/off */
		if (ch.code == '!')
			case_sensitive = !case_sensitive;

		/* Try showing */
		if (ch.code == '&') {
			/* Get "shower" */
			prt("Show: ", hgt - 1, 0);
			(void)askfor_aux(shower, sizeof(shower), NULL);

			/* Make the "shower" lowercase */
			if (!case_sensitive) string_lower(shower);
		}

		/* Try finding */
		if (ch.code == '/') {
			/* Get "finder" */
			prt("Find: ", hgt - 1, 0);
			if (askfor_aux(finder, sizeof(finder), NULL)) {
				/* Find it */
				find = finder;
				back = line;
				line = line + 1;

				/* Make the "finder" lowercase */
				if (!case_sensitive) string_lower(finder);

				/* Show it */
				my_strcpy(shower, finder, sizeof(shower));
			}
		}

		/* Go to a specific line */
		if (ch.code == '#') {
			char tmp[80] = "0";

			prt("Goto Line: ", hgt - 1, 0);
			if (askfor_aux(tmp, sizeof(tmp), NULL))
				line = atoi(tmp);
		}

		/* Go to a specific file */
		if (ch.code == '%') {
			char ftmp[80];

			if (OPT(player, rogue_like_commands)) {
				my_strcpy(ftmp, "r_index.txt", sizeof(ftmp));
			} else {
				my_strcpy(ftmp, "index.txt", sizeof(ftmp));
			}

			prt("Goto File: ", hgt - 1, 0);
			if (askfor_aux(ftmp, sizeof(ftmp), NULL)) {
				if (!show_file(ftmp, NULL, 0, mode))
					ch.code = ESCAPE;
			}
		}

		switch (ch.code) {
			/* up a line */
			case ARROW_UP:
			case 'k':
			case '8': line--; break;

			/* up a page */
			case KC_PGUP:
			case '9':
			case '-': line -= (hgt - 4); break;

			/* home */
			case KC_HOME:
			case '7': line = 0; break;

			/* down a line */
			case ARROW_DOWN:
			case '2':
			case 'j':
			case KC_ENTER: line++; break;

			/* down a page */
			case KC_PGDOWN:
			case '3':
			case ' ': line += hgt - 4; break;

			/* end */
			case KC_END:
			case '1': line = size; break;
		}

		/* Recurse on letters */
		if (menu && isalpha((unsigned char)ch.code)) {
			/* Extract the requested menu item */
			k = A2I(ch.code);

			/* Verify the menu item */
			if ((k >= 0) && (k <= 25) && hook[k][0]) {
				/* Recurse on that file */
				if (!show_file(hook[k], NULL, 0, mode)) ch.code = ESCAPE;
			}
		}

		/* Exit on escape */
		if (ch.code == ESCAPE) break;
	}

	/* Close the file */
	file_close(fff);

	/* Done */
	return (ch.code != '?');
}